

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscriber_link.cpp
# Opt level: O3

string * __thiscall miniros::SubscriberLink::getMessageDefinition_abi_cxx11_(SubscriberLink *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Atomic_word _Var2;
  string *psVar3;
  element_type *peVar4;
  bool bVar5;
  
  this_00 = (this->parent_).super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  psVar3 = (string *)0x60;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var2 = this_00->_M_use_count;
    do {
      if (_Var2 == 0) {
        return (string *)0x60;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar5 = _Var2 == iVar1;
      if (bVar5) {
        this_00->_M_use_count = _Var2 + 1;
        iVar1 = _Var2;
      }
      _Var2 = iVar1;
      UNLOCK();
    } while (!bVar5);
    if (this_00->_M_use_count == 0) {
      peVar4 = (element_type *)0x0;
    }
    else {
      peVar4 = (this->parent_).super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    psVar3 = &peVar4->message_definition_;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return psVar3;
}

Assistant:

const std::string& SubscriberLink::getMessageDefinition()
{
  PublicationPtr parent = parent_.lock();
  return parent->getMessageDefinition();
}